

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O2

int pzshape::TPZShapeQuad::NConnectShapeF(int side,int order)

{
  int iVar1;
  ostream *poVar2;
  
  if (side < 4) {
    return 1;
  }
  if ((uint)side < 8) {
    iVar1 = order + -1;
  }
  else if (side == 8) {
    iVar1 = (order + -1) * (order + -1);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "TPZShapeQuad::NConnectShapeF, bad parameter side ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,side);
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int TPZShapeQuad::NConnectShapeF(int side, int order) {
		if(side<4) return 1;//0 a 4
		//   int s = side-4;//s = 0 a 14 ou side = 6 a 20
#ifdef PZDEBUG
        {
//            if(order <1) DebugStop();
        }
#endif
		if(side<8) return (order-1);//6 a 14
		if(side==8) {
			return ((order-1)*(order-1));
		}
		PZError << "TPZShapeQuad::NConnectShapeF, bad parameter side " << side << endl;
		return 0;
	}